

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.inc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::cpp_unittest::GeneratedMessageTest_CopyConstructorWithArenas_Test::
GeneratedMessageTest_CopyConstructorWithArenas_Test
          (GeneratedMessageTest_CopyConstructorWithArenas_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0164fa50;
  return;
}

Assistant:

TEST(GENERATED_MESSAGE_TEST_NAME, CopyConstructorWithArenas) {
  Arena arena;
  UNITTEST::TestAllTypes* message1 =
      Arena::Create<UNITTEST::TestAllTypes>(&arena);
  TestUtil::SetAllFields(message1);

  UNITTEST::TestAllTypes message2_stack(*message1);
  TestUtil::ExpectAllFieldsSet(message2_stack);

  std::unique_ptr<UNITTEST::TestAllTypes> message2_heap(
      new UNITTEST::TestAllTypes(*message1));
  TestUtil::ExpectAllFieldsSet(*message2_heap);

  arena.Reset();

  // Verify that the copies are still intact.
  TestUtil::ExpectAllFieldsSet(message2_stack);
  TestUtil::ExpectAllFieldsSet(*message2_heap);
}